

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column_data.cpp
# Opt level: O0

void __thiscall
duckdb::ListColumnCheckpointState::~ListColumnCheckpointState(ListColumnCheckpointState *this)

{
  ListColumnCheckpointState *in_RDI;
  
  ~ListColumnCheckpointState(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

ListColumnCheckpointState(RowGroup &row_group, ColumnData &column_data, PartialBlockManager &partial_block_manager)
	    : ColumnCheckpointState(row_group, column_data, partial_block_manager) {
		global_stats = ListStats::CreateEmpty(column_data.type).ToUnique();
	}